

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.cxx
# Opt level: O2

void FileParse::trimTrailingZeros(string *str,bool useScientific)

{
  size_type sVar1;
  size_type sVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,useScientific) == 0) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(str,'0',0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (str,sVar1 + 1,0xffffffffffffffff);
    if ((str->_M_dataplus)._M_p[str->_M_string_length - 1] != '.') {
      return;
    }
    sVar2 = str->_M_string_length - 1;
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(str,"eE",0);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(str,'0',sVar1 - 1);
    if ((sVar2 != 0xffffffffffffffff) && (sVar2 + 1 < sVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,sVar2 + 1,sVar1 + ~sVar2);
    }
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(str,".eE",sVar2);
    if (((sVar2 == 0xffffffffffffffff) || (str->_M_string_length <= sVar2 + 1)) ||
       ((byte)((str->_M_dataplus)._M_p[sVar2 + 1] | 0x20U) != 0x65)) {
      return;
    }
    sVar1 = 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (str,sVar2,sVar1);
  return;
}

Assistant:

void trimTrailingZeros(std::string & str, bool useScientific)
    {
        if(useScientific)
        {
            // Find the exponent and trim zeros before it
            auto ePos = str.find_first_of("eE");
            auto lastNonZero = str.find_last_not_of('0', ePos - 1);
            if(lastNonZero != std::string::npos && lastNonZero + 1 < ePos)
            {
                str.erase(lastNonZero + 1, ePos - lastNonZero - 1);
            }
            // Remove the decimal point if it's directly before 'e' or 'E'
            auto dotEPos = str.find_first_of(".eE", lastNonZero);
            if (dotEPos != std::string::npos &&
               (dotEPos + 1 < str.size()) &&
               (str[dotEPos + 1] == 'e' || str[dotEPos + 1] == 'E'))
            {
                str.erase(dotEPos, 1);
            }

        }
        else
        {
            // Remove trailing zeros for non-scientific notation
            str.erase(str.find_last_not_of('0') + 1, std::string::npos);
            // Remove decimal point if no decimal part remains
            if(str.back() == '.')
            {
                str.erase(str.length() - 1);
            }
        }
    }